

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O1

object * newLInteger(int64_t val)

{
  object *poVar1;
  
  poVar1 = gcialloc(8);
  poVar1->class = IntegerClass;
  poVar1[1].header = val;
  return poVar1;
}

Assistant:

struct object *newLInteger(int64_t val)
{
    struct object *res;
    int64_t *tmp;

    res = gcialloc(sizeof(int64_t));
    res->class = IntegerClass;
    tmp = (int64_t *)bytePtr(res);
    *tmp = val;
    return(res);
}